

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::detail::rawMemoryToString(String *__return_storage_ptr__,void *object,uint size)

{
  _func_int *p_Var1;
  ostream *poVar2;
  _func_int **pp_Var3;
  long lVar4;
  
  poVar2 = tlssPush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0x",2);
  pp_Var3 = poVar2->_vptr_basic_ostream;
  p_Var1 = (_func_int *)((long)&poVar2->_vptr_basic_ostream + (long)pp_Var3[-3]);
  if ((&poVar2->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
    std::ios::widen((char)p_Var1);
    p_Var1[0xe1] = (code)0x1;
    pp_Var3 = poVar2->_vptr_basic_ostream;
  }
  p_Var1[0xe0] = (code)0x30;
  *(uint *)(&poVar2->field_0x18 + (long)pp_Var3[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
  if (size != 0) {
    lVar4 = (long)(int)size;
    do {
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned const char* bytes = static_cast<unsigned const char*>(object);
        std::ostream*        oss   = tlssPush();
        *oss << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            *oss << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return tlssPop();
    }